

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

gs_expr_t * gs_parse_expr_factor(gs_parser_t *parser)

{
  char cVar1;
  int iVar2;
  gs_token_type gVar3;
  gs_token_t *pgVar4;
  anon_union_8_5_f029217d_for_gs_token_3 aVar5;
  gs_token_type gVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  gs_expr_t *pgVar10;
  gs_expr_t *pgVar11;
  gs_expr_t *pgVar12;
  int iVar13;
  gs_token_t token;
  
  pgVar4 = (parser->tokens).data;
  aVar5 = pgVar4[parser->cur_token].field_3;
  pgVar4 = pgVar4 + parser->cur_token;
  gVar6 = pgVar4->type;
  iVar7 = pgVar4->line;
  iVar8 = pgVar4->col;
  uVar9 = *(undefined4 *)&pgVar4->field_0xc;
  pgVar10 = gs_parse_expr_cast(parser);
  if (parser->error != false) {
    return pgVar10;
  }
  do {
    pgVar4 = (parser->tokens).data;
    iVar2 = parser->cur_token;
    gVar3 = pgVar4[iVar2].type;
    cVar1 = pgVar4[iVar2].field_3.c;
    if (cVar1 == '*' && gVar3 == GS_TOKEN_CHAR) {
      iVar13 = 2;
    }
    else {
      if (gVar3 != GS_TOKEN_CHAR) {
        return pgVar10;
      }
      if (cVar1 != '/') {
        return pgVar10;
      }
      iVar13 = 3;
    }
    if (iVar2 < (parser->tokens).length) {
      parser->cur_token = iVar2 + 1;
    }
    pgVar11 = gs_parse_expr_cast(parser);
    if (parser->error != false) {
      return pgVar10;
    }
    pgVar12 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
    pgVar12->type = GS_EXPR_BINARY_OP;
    (pgVar12->token).type = gVar6;
    (pgVar12->token).line = iVar7;
    (pgVar12->token).col = iVar8;
    *(undefined4 *)&(pgVar12->token).field_0xc = uVar9;
    (pgVar12->token).field_3 = aVar5;
    (pgVar12->field_2).int_val = iVar13;
    (pgVar12->field_2).binary_op.left = pgVar10;
    (pgVar12->field_2).binary_op.right = pgVar11;
    pgVar10 = pgVar12;
  } while( true );
}

Assistant:

static gs_expr_t *gs_parse_expr_factor(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_cast(parser);
    if (parser->error) goto cleanup;

    while (true) {
        gs_binary_op_type binary_op_type;
        if (gs_eat_char(parser, '*')) {
            binary_op_type = GS_BINARY_OP_MUL;
        }
        else if (gs_eat_char(parser, '/')) {
            binary_op_type = GS_BINARY_OP_DIV;
        }
        else {
            break;
        }

        gs_expr_t *right = gs_parse_expr_cast(parser);
        if (parser->error) goto cleanup;
        expr = gs_expr_binary_op_new(parser, token, binary_op_type, expr, right);
    }

cleanup:
    return expr;
}